

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

pointer __thiscall
slang::SmallVectorBase<slang::IntervalMapDetails::Path::Entry>::
emplaceRealloc<slang::IntervalMapDetails::LeafNode<unsigned_long,std::monostate,11u,true>*&,unsigned_int&,unsigned_int&>
          (SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *this,pointer pos,
          LeafNode<unsigned_long,_std::monostate,_11U,_true> **args,uint *args_1,uint *args_2)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  pointer p;
  uint32_t uVar4;
  uint32_t uVar5;
  pointer pEVar6;
  pointer pEVar7;
  pointer pEVar8;
  long lVar9;
  long lVar10;
  size_type sVar11;
  ulong uVar12;
  
  if (this->len == 0x7ffffffffffffff) {
    detail::throwLengthError();
  }
  uVar12 = this->len + 1;
  uVar3 = this->cap;
  if (uVar12 < uVar3 * 2) {
    uVar12 = uVar3 * 2;
  }
  if (0x7ffffffffffffff - uVar3 < uVar3) {
    uVar12 = 0x7ffffffffffffff;
  }
  lVar10 = (long)pos - (long)this->data_;
  pEVar6 = (pointer)operator_new(uVar12 << 4);
  uVar1 = *args_1;
  uVar2 = *args_2;
  *(LeafNode<unsigned_long,_std::monostate,_11U,_true> **)((long)pEVar6 + lVar10) = *args;
  *(uint *)((long)pEVar6 + lVar10 + 8) = uVar1;
  *(uint *)((long)pEVar6 + lVar10 + 0xc) = uVar2;
  p = this->data_;
  sVar11 = this->len;
  lVar9 = (long)p + (sVar11 * 0x10 - (long)pos);
  pEVar7 = p;
  pEVar8 = pEVar6;
  if (lVar9 == 0) {
    pEVar7 = pEVar6;
    pEVar8 = p;
    if (sVar11 != 0) {
      do {
        uVar4 = pEVar8->size;
        uVar5 = pEVar8->offset;
        pEVar7->node = pEVar8->node;
        pEVar7->size = uVar4;
        pEVar7->offset = uVar5;
        pEVar8 = pEVar8 + 1;
        pEVar7 = pEVar7 + 1;
      } while (pEVar8 != pos);
    }
  }
  else {
    for (; pEVar7 != pos; pEVar7 = pEVar7 + 1) {
      uVar4 = pEVar7->size;
      uVar5 = pEVar7->offset;
      pEVar8->node = pEVar7->node;
      pEVar8->size = uVar4;
      pEVar8->offset = uVar5;
      pEVar8 = pEVar8 + 1;
    }
    memcpy((void *)((long)pEVar6 + lVar10 + 0x10),pos,(lVar9 - 0x10U & 0xfffffffffffffff0) + 0x10);
  }
  if (p != (pointer)this->firstElement) {
    operator_delete(p);
    sVar11 = this->len;
  }
  this->len = sVar11 + 1;
  this->cap = uVar12;
  this->data_ = pEVar6;
  return (pointer)((long)pEVar6 + lVar10);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}